

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O1

int __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::init
          (FileManager<sjtu::TrainManager::stationNameType> *this,EVP_PKEY_CTX *ctx)

{
  fstream *pfVar1;
  byte bVar2;
  int iVar3;
  LRUCache<sjtu::TrainManager::stationNameType> *pLVar4;
  Node *pNVar5;
  byte in_CL;
  uint in_EDX;
  ofstream outfile;
  ifstream infile;
  long local_430;
  filebuf local_428 [240];
  ios_base local_338 [264];
  undefined1 local_230 [520];
  
  pLVar4 = (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache;
  if (pLVar4 != (LRUCache<sjtu::TrainManager::stationNameType> *)0x0) {
    LRUCache<sjtu::TrainManager::stationNameType>::~LRUCache(pLVar4);
    operator_delete(pLVar4,0x48);
  }
  pLVar4 = (LRUCache<sjtu::TrainManager::stationNameType> *)operator_new(0x48);
  pfVar1 = &(this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).file;
  pLVar4->file = pfVar1;
  pLVar4->block_lim = (ulong)in_EDX;
  pLVar4->attempt_count = 0;
  pLVar4->miss_count = 0;
  pLVar4->head = (CacheNode *)0x0;
  pLVar4->tail = (CacheNode *)0x0;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->value = (value_type *)0x0;
  pNVar5->color = BLACK;
  pNVar5->left = (Node *)0x0;
  pNVar5->right = (Node *)0x0;
  pNVar5->parent = (Node *)0x0;
  (pLVar4->table).nil = pNVar5;
  (pLVar4->table).nodebegin = pNVar5;
  pNVar5->right = pNVar5;
  pNVar5->left = pNVar5;
  pNVar5->parent = pNVar5;
  (pLVar4->table).tot = 0;
  (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache = pLVar4;
  std::ifstream::ifstream(local_230,(string *)ctx,_S_in);
  bVar2 = std::__basic_file<char>::is_open();
  if ((byte)(bVar2 ^ 1 | in_CL) == 1) {
    (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).is_newfile = true;
    std::ofstream::ofstream(&local_430,(string *)ctx,_S_out|_S_bin);
    std::ofstream::close();
    local_430 = _VTT;
    *(undefined8 *)(local_428 + *(long *)(_VTT + -0x18) + -8) = _tellp;
    std::filebuf::~filebuf(local_428);
    std::ios_base::~ios_base(local_338);
  }
  else {
    (this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).is_newfile = false;
  }
  std::ifstream::close();
  std::fstream::open((string *)pfVar1,(_Ios_Openmode)ctx);
  iVar3 = std::ifstream::~ifstream(local_230);
  return iVar3;
}

Assistant:

virtual void init(std::string filepath , unsigned int cache_size , bool is_reset = false) override
		{
			if (cache) delete cache;
			cache = new LRUCache<T>(cache_size , file);
			std::ifstream infile(filepath , std::ios_base::in);
			if (!infile.is_open() || is_reset)
			{
				is_newfile = true;
				std::ofstream outfile(filepath , std::ios_base::out | std::ios_base::binary);
				outfile.close();
			}else is_newfile = false;
			infile.close();
			file.open(filepath , std::ios_base::in | std::ios_base::out | std::ios_base::binary);
		}